

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.h
# Opt level: O0

bool __thiscall
Clasp::Antecedent::minimize<Clasp::Solver>(Antecedent *this,Solver *s,Literal p,CCMinRecursive *rec)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  Literal p_00;
  Constraint *pCVar4;
  undefined8 in_RCX;
  uint in_EDX;
  Antecedent *in_RSI;
  Solver *in_RDI;
  Type t;
  Antecedent *in_stack_ffffffffffffffa8;
  bool local_49;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  byte bVar5;
  bool local_1;
  
  TVar2 = type((Antecedent *)in_RDI);
  if (TVar2 == Generic) {
    pCVar4 = constraint((Antecedent *)in_RDI);
    iVar3 = (*pCVar4->_vptr_Constraint[7])(pCVar4,in_RSI,(ulong)in_EDX,in_RCX);
    local_1 = (bool)((byte)iVar3 & 1);
  }
  else {
    p_00 = firstLiteral(in_stack_ffffffffffffffa8);
    bVar1 = Solver::ccMinimize(in_RDI,p_00,
                               (CCMinRecursive *)
                               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    bVar5 = false;
    local_1 = (bool)bVar5;
    if ((bVar1) && (local_49 = true, local_1 = local_49, TVar2 == Ternary)) {
      secondLiteral(in_RSI);
      local_1 = Solver::ccMinimize(in_RDI,p_00,
                                   (CCMinRecursive *)CONCAT17(bVar5,in_stack_ffffffffffffffc0));
    }
  }
  return local_1;
}

Assistant:

bool minimize(S& s, Literal p, CCMinRecursive* rec) const {
		assert(!isNull());
		Type t = type();
		if (t == Generic) {
			return constraint()->minimize(s, p, rec);
		}
		return s.ccMinimize(firstLiteral(), rec) && (t != Ternary || s.ccMinimize(secondLiteral(), rec));
	}